

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O2

string * __thiscall
CommandLineParser::getNextOptionalParameter_abi_cxx11_
          (string *__return_storage_ptr__,CommandLineParser *this)

{
  bool bVar1;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"-",&local_61);
  bVar1 = argumentStartsWith(this,&local_60);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,":",&local_62);
    bVar1 = argumentStartsWith(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    if (!bVar1) {
      getNextArgument_abi_cxx11_(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string
CommandLineParser::getNextOptionalParameter()
{
  if ( argumentStartsWith( "-" )  ||  argumentStartsWith( ":" ) )
    return "";
  return getNextArgument();
}